

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O2

void __thiscall
StunMsgCxx_RFC5769SampleIPv4Response_Test::TestBody(StunMsgCxx_RFC5769SampleIPv4Response_Test *this)

{
  sockaddr_in *psVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  AssertionResult *pAVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar6;
  char *in_R9;
  bool bVar7;
  self_type sVar8;
  AssertionResult gtest_ar__3;
  msgint local_e8;
  AssertHelper local_d0;
  AssertionResult gtest_ar;
  sockaddr_in test_addr;
  iterator i;
  message message;
  char software_name [12];
  char password [23];
  sockaddr_in ipv4;
  uint8_t tsx_id [12];
  
  pAVar5 = &gtest_ar__3;
  builtin_strncpy(software_name,"test vector",0xc);
  builtin_strncpy(password,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  tsx_id[0] = 0xb7;
  tsx_id[1] = 0xe7;
  tsx_id[2] = 0xa7;
  tsx_id[3] = '\x01';
  tsx_id[4] = 0xbc;
  tsx_id[5] = '4';
  tsx_id[6] = 0xd6;
  tsx_id[7] = 0x86;
  tsx_id[8] = 0xfa;
  tsx_id[9] = 0x87;
  tsx_id[10] = 0xdf;
  tsx_id[0xb] = 0xae;
  ipv4.sin_family = 2;
  ipv4.sin_port = 0x5580;
  inet_pton(2,"192.0.2.1",&ipv4.sin_addr);
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)&message,0x101,tsx_id);
  strlen(software_name);
  gtest_ar._0_2_ = 0x8022;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)software_name;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&message,(varsize<char> *)&gtest_ar);
  i.attr_.msg_hdr_._0_2_ = 0x20;
  i.attr_.attr_hdr_ = (stun_attr_hdr *)&ipv4;
  stun::base_message<std::allocator<unsigned_char>_>::
  push_back<stun::attribute::bits::xor_socket_address>(&message,(xor_socket_address *)&i);
  test_addr = (sockaddr_in)stun::attribute::message_integrity(password);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&message,(msgint *)&test_addr);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::fingerprint>
            (&message,(fingerprint *)&gtest_ar__3);
  i.attr_.msg_hdr_ = (stun_msg_hdr *)0x50;
  sVar4 = stun_msg_len((stun_msg_hdr *)
                       message.buffer_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
  test_addr.sin_family = (short)sVar4;
  test_addr.sin_port = (short)(sVar4 >> 0x10);
  test_addr.sin_addr.s_addr = (int)(sVar4 >> 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","message.size()",(unsigned_long *)&i,
             (unsigned_long *)&test_addr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&i);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_addr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xeb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_addr,(Message *)&i);
    psVar1 = (sockaddr_in *)&gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_addr);
    pAVar5 = (AssertionResult *)&i;
LAB_0012c62b:
    this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)psVar1->sin_zero;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pAVar5);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    anon_unknown.dwarf_19b63::IsEqual
              ((anon_unknown_dwarf_19b63 *)&i,&DAT_001473c0,
               message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x50);
    if ((char)i.attr_.msg_hdr_ == '\0') {
      testing::Message::Message((Message *)&test_addr);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&i,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xed,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&test_addr)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&test_addr);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&i.attr_.attr_hdr_);
    i.attr_.msg_hdr_._0_4_ = 0x101;
    uVar2 = stun_msg_type((stun_msg_hdr *)
                          message.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    test_addr.sin_family = uVar2;
    testing::internal::
    CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((internal *)&gtest_ar,"stun::message::binding_response","message.type()",(type *)&i,
               &test_addr.sin_family);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&i);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&test_addr,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xf1,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&test_addr,(Message *)&i);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_addr);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&i);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    i = stun::base_message<std::allocator<unsigned_char>_>::begin(&message);
    bVar7 = i.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    test_addr._1_7_ = test_addr._1_7_;
    test_addr.sin_family._0_1_ = !bVar7;
    test_addr.sin_zero[0] = '\0';
    test_addr.sin_zero[1] = '\0';
    test_addr.sin_zero[2] = '\0';
    test_addr.sin_zero[3] = '\0';
    test_addr.sin_zero[4] = '\0';
    test_addr.sin_zero[5] = '\0';
    test_addr.sin_zero[6] = '\0';
    test_addr.sin_zero[7] = '\0';
    if (bVar7) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&test_addr,(AssertionResult *)"message.end() != i",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xf4,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
LAB_0012c5d2:
      psVar1 = &test_addr;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      test_addr.sin_family = 0x8022;
      test_addr.sin_port = 0;
      uVar2 = stun_attr_type(i.attr_.attr_hdr_);
      gtest_ar__3._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)&gtest_ar,"type::software","i->type()",(attribute_type *)&test_addr,
                 (unsigned_short *)&gtest_ar__3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&test_addr);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xf5,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__3,(Message *)&test_addr);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&test_addr);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar__3._0_8_ = i.attr_.msg_hdr_;
      gtest_ar__3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                ((string *)&gtest_ar,(string *)&gtest_ar__3);
      testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                ((internal *)&test_addr,"software_name","i->to<type::software>().to_string()",
                 &software_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((char)test_addr.sin_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar);
        if (test_addr.sin_zero == (uchar  [8])0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)test_addr.sin_zero;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xf7,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar);
        psVar1 = &test_addr;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        pAVar5 = &gtest_ar;
        goto LAB_0012c62b;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      sVar8 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
      bVar7 = sVar8.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
      test_addr._1_7_ = test_addr._1_7_;
      test_addr.sin_family._0_1_ = !bVar7;
      test_addr.sin_zero[0] = '\0';
      test_addr.sin_zero[1] = '\0';
      test_addr.sin_zero[2] = '\0';
      test_addr.sin_zero[3] = '\0';
      test_addr.sin_zero[4] = '\0';
      test_addr.sin_zero[5] = '\0';
      test_addr.sin_zero[6] = '\0';
      test_addr.sin_zero[7] = '\0';
      if (bVar7) {
        testing::Message::Message((Message *)&gtest_ar__3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&test_addr,
                   (AssertionResult *)"message.end() != ++i","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xf9,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
        goto LAB_0012c5d2;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      test_addr.sin_family = 0x20;
      test_addr.sin_port = 0;
      uVar2 = stun_attr_type(i.attr_.attr_hdr_);
      gtest_ar__3._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)&gtest_ar,"type::xor_mapped_address","i->type()",
                 (attribute_type *)&test_addr,(unsigned_short *)&gtest_ar__3);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&test_addr);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xfa,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__3,(Message *)&test_addr);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&test_addr);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      test_addr = (sockaddr_in)ZEXT816(0);
      gtest_ar._0_8_ = i.attr_.msg_hdr_;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
      bVar7 = stun::attribute::decoding_bits::xor_socket_address::to_sockaddr
                        ((xor_socket_address *)&gtest_ar,(sockaddr *)&test_addr);
      gtest_ar__3.success_ = bVar7;
      gtest_ar__3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar7) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                   (AssertionResult *)
                   "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xfe,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_e8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__3.message_);
      gtest_ar__3._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,unsigned_short>
                ((internal *)&gtest_ar,"2","test_addr.sin_family",(int *)&gtest_ar__3,
                 &test_addr.sin_family);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__3);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0xff,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__3);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar__3._0_2_ = 0x5580;
      testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                ((internal *)&gtest_ar,"__bswap_16 (32853)","test_addr.sin_port",
                 (unsigned_short *)&gtest_ar__3,&test_addr.sin_port);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__3);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x100,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__3);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
      iVar3 = memcmp(&test_addr.sin_addr,&ipv4.sin_addr,4);
      local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
           (stun_msg_hdr *)
           CONCAT44(local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_._4_4_,iVar3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"0",
                 "memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",
                 (int *)&gtest_ar__3,(int *)&local_e8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__3);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x102,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__3);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      sVar8 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
      gtest_ar__3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar7 = sVar8.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
      gtest_ar__3.success_ = !bVar7;
      if (bVar7) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                   (AssertionResult *)"message.end() != ++i","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x104,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__3.message_);
        gtest_ar__3._0_4_ = 8;
        uVar2 = stun_attr_type(i.attr_.attr_hdr_);
        local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
             (stun_msg_hdr *)
             CONCAT62(local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_._2_6_,uVar2);
        testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                  ((internal *)&gtest_ar,"type::message_integrity","i->type()",
                   (attribute_type *)&gtest_ar__3,(unsigned_short *)&local_e8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__3);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_e8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x105,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__3);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_ = i.attr_.msg_hdr_;
        local_e8.super_attribute_base<_stun_attr_msgint>.attr_ =
             (_stun_attr_msgint *)i.attr_.attr_hdr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar,password,(allocator<char> *)&local_d0);
        bVar7 = stun::attribute::decoding_bits::msgint::check_integrity
                          (&local_e8,(string *)&gtest_ar);
        gtest_ar__3.success_ = bVar7;
        gtest_ar__3.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar__3.success_ == false) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                     (AssertionResult *)"i->to<type::message_integrity>().check_integrity(password)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x107,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_e8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__3.message_);
        sVar8 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
        gtest_ar__3.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar7 = sVar8.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
        gtest_ar__3.success_ = !bVar7;
        if (bVar7) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                     (AssertionResult *)"message.end() != ++i","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x109,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__3.message_);
          gtest_ar__3._0_4_ = 0x8028;
          uVar2 = stun_attr_type(i.attr_.attr_hdr_);
          local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_ =
               (stun_msg_hdr *)
               CONCAT62(local_e8.super_attribute_base<_stun_attr_msgint>.msg_hdr_._2_6_,uVar2);
          testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                    ((internal *)&gtest_ar,"type::fingerprint","i->type()",
                     (attribute_type *)&gtest_ar__3,(unsigned_short *)&local_e8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__3);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x10a,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_e8,(Message *)&gtest_ar__3);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__3);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          gtest_ar._0_8_ = i.attr_.msg_hdr_;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               i.attr_.attr_hdr_;
          bVar7 = stun::attribute::decoding_bits::fingerprint::check_integrity
                            ((fingerprint *)&gtest_ar);
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar__3.success_ = bVar7;
          if (!bVar7) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                       (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x10c,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_e8);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__3.message_);
          sVar8 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
          this_00 = &gtest_ar__3.message_;
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar__3.success_ = sVar8.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
          if (gtest_ar__3.success_) goto LAB_0012cd3b;
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__3,
                     (AssertionResult *)"message.end() == ++i","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x10e,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
        }
      }
      psVar1 = (sockaddr_in *)&gtest_ar__3;
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      pAVar5 = (AssertionResult *)&local_e8;
    }
    this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)psVar1->sin_zero;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pAVar5);
  }
LAB_0012cd3b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&message);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv4)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}